

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O0

ostream * sjtu::operator<<(ostream *output,timeType *obj)

{
  ostream *poVar1;
  int *in_RSI;
  ostream *in_RDI;
  
  if (*in_RSI < 10) {
    if (in_RSI[1] < 10) {
      if (in_RSI[2] < 10) {
        if (in_RSI[3] < 10) {
          poVar1 = std::operator<<(in_RDI,'0');
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
          poVar1 = std::operator<<(poVar1,'-');
          poVar1 = std::operator<<(poVar1,'0');
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
          poVar1 = std::operator<<(poVar1," 0");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
          poVar1 = std::operator<<(poVar1,":0");
          std::ostream::operator<<(poVar1,in_RSI[3]);
        }
        else {
          poVar1 = std::operator<<(in_RDI,'0');
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
          poVar1 = std::operator<<(poVar1,'-');
          poVar1 = std::operator<<(poVar1,'0');
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
          poVar1 = std::operator<<(poVar1," 0");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
          poVar1 = std::operator<<(poVar1,":");
          std::ostream::operator<<(poVar1,in_RSI[3]);
        }
      }
      else if (in_RSI[3] < 10) {
        poVar1 = std::operator<<(in_RDI,'0');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
        poVar1 = std::operator<<(poVar1,'-');
        poVar1 = std::operator<<(poVar1,'0');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
        poVar1 = std::operator<<(poVar1," ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
        poVar1 = std::operator<<(poVar1,":0");
        std::ostream::operator<<(poVar1,in_RSI[3]);
      }
      else {
        poVar1 = std::operator<<(in_RDI,'0');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
        poVar1 = std::operator<<(poVar1,'-');
        poVar1 = std::operator<<(poVar1,'0');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
        poVar1 = std::operator<<(poVar1," ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
        poVar1 = std::operator<<(poVar1,":");
        std::ostream::operator<<(poVar1,in_RSI[3]);
      }
    }
    else if (in_RSI[2] < 10) {
      if (in_RSI[3] < 10) {
        poVar1 = std::operator<<(in_RDI,'0');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
        poVar1 = std::operator<<(poVar1,'-');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
        poVar1 = std::operator<<(poVar1," 0");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
        poVar1 = std::operator<<(poVar1,":0");
        std::ostream::operator<<(poVar1,in_RSI[3]);
      }
      else {
        poVar1 = std::operator<<(in_RDI,'0');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
        poVar1 = std::operator<<(poVar1,'-');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
        poVar1 = std::operator<<(poVar1," 0");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
        poVar1 = std::operator<<(poVar1,":");
        std::ostream::operator<<(poVar1,in_RSI[3]);
      }
    }
    else if (in_RSI[3] < 10) {
      poVar1 = std::operator<<(in_RDI,'0');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
      poVar1 = std::operator<<(poVar1,'-');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
      poVar1 = std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
      poVar1 = std::operator<<(poVar1,":0");
      std::ostream::operator<<(poVar1,in_RSI[3]);
    }
    else {
      poVar1 = std::operator<<(in_RDI,'0');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
      poVar1 = std::operator<<(poVar1,'-');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
      poVar1 = std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
      poVar1 = std::operator<<(poVar1,":");
      std::ostream::operator<<(poVar1,in_RSI[3]);
    }
  }
  else if (in_RSI[1] < 10) {
    if (in_RSI[2] < 10) {
      if (in_RSI[3] < 10) {
        poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
        poVar1 = std::operator<<(poVar1,'-');
        poVar1 = std::operator<<(poVar1,'0');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
        poVar1 = std::operator<<(poVar1," 0");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
        poVar1 = std::operator<<(poVar1,":0");
        std::ostream::operator<<(poVar1,in_RSI[3]);
      }
      else {
        poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
        poVar1 = std::operator<<(poVar1,'-');
        poVar1 = std::operator<<(poVar1,'0');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
        poVar1 = std::operator<<(poVar1," 0");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
        poVar1 = std::operator<<(poVar1,":");
        std::ostream::operator<<(poVar1,in_RSI[3]);
      }
    }
    else if (in_RSI[3] < 10) {
      poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
      poVar1 = std::operator<<(poVar1,'-');
      poVar1 = std::operator<<(poVar1,'0');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
      poVar1 = std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
      poVar1 = std::operator<<(poVar1,":0");
      std::ostream::operator<<(poVar1,in_RSI[3]);
    }
    else {
      poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
      poVar1 = std::operator<<(poVar1,'-');
      poVar1 = std::operator<<(poVar1,'0');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
      poVar1 = std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
      poVar1 = std::operator<<(poVar1,":");
      std::ostream::operator<<(poVar1,in_RSI[3]);
    }
  }
  else if (in_RSI[2] < 10) {
    if (in_RSI[3] < 10) {
      poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
      poVar1 = std::operator<<(poVar1,'-');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
      poVar1 = std::operator<<(poVar1," 0");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
      poVar1 = std::operator<<(poVar1,":0");
      std::ostream::operator<<(poVar1,in_RSI[3]);
    }
    else {
      poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
      poVar1 = std::operator<<(poVar1,'-');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
      poVar1 = std::operator<<(poVar1," 0");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
      poVar1 = std::operator<<(poVar1,":");
      std::ostream::operator<<(poVar1,in_RSI[3]);
    }
  }
  else if (in_RSI[3] < 10) {
    poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
    poVar1 = std::operator<<(poVar1,'-');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
    poVar1 = std::operator<<(poVar1,":0");
    std::ostream::operator<<(poVar1,in_RSI[3]);
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
    poVar1 = std::operator<<(poVar1,'-');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,in_RSI[3]);
  }
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &output, const timeType &obj) {
            if (obj.month < 10) {
                if (obj.day < 10) {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << '0' << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << '0' << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
                else {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << '0' << obj.month << '-' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' <<  obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << '0' << obj.month << '-' <<  obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << '0' << obj.month << '-' <<  obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
            }
            else {
                if (obj.day < 10) {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' << '0' << obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' << '0' << obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
                else {
                    if (obj.hour < 10) {
                        if (obj.minute < 10) output << obj.month << '-' << obj.day << " 0" << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' <<  obj.day << " 0" << obj.hour << ":" << obj.minute;
                    }
                    else {
                        if (obj.minute < 10) output << obj.month << '-' <<  obj.day << " " << obj.hour << ":0" << obj.minute;
                        else output << obj.month << '-' <<  obj.day << " " << obj.hour << ":" << obj.minute;
                    }
                }
            }
            return output;
        }